

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O0

SRes crnlib::LzmaDec_DecodeToDic
               (CLzmaDec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,ELzmaFinishMode finishMode,
               ELzmaStatus *status)

{
  uint uVar1;
  SizeT SVar2;
  ELzmaDummy EVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  uint local_6c;
  int dummyRes_1;
  uint lookAhead;
  uint rem;
  int dummyRes;
  Byte *bufLimit;
  SizeT processed;
  SizeT SStack_48;
  int checkEndMarkNow;
  SizeT inSize;
  ELzmaStatus *status_local;
  ELzmaFinishMode finishMode_local;
  SizeT *srcLen_local;
  Byte *src_local;
  SizeT dicLimit_local;
  CLzmaDec *p_local;
  
  SStack_48 = *srcLen;
  *srcLen = 0;
  LzmaDec_WriteRem(p,dicLimit);
  *status = LZMA_STATUS_NOT_SPECIFIED;
  srcLen_local = (SizeT *)src;
  do {
    if (p->remainLen == 0x112) {
      if (p->code == 0) {
        *status = LZMA_STATUS_FINISHED_WITH_MARK;
      }
      return (uint)(p->code != 0);
    }
    if (p->needFlush != 0) {
      while( true ) {
        bVar6 = false;
        if (SStack_48 != 0) {
          bVar6 = p->tempBufSize < 5;
        }
        if (!bVar6) break;
        SVar2 = *srcLen_local;
        uVar1 = p->tempBufSize;
        p->tempBufSize = uVar1 + 1;
        p->tempBuf[uVar1] = (Byte)SVar2;
        *srcLen = *srcLen + 1;
        SStack_48 = SStack_48 - 1;
        srcLen_local = (SizeT *)((long)srcLen_local + 1);
      }
      if (p->tempBufSize < 5) {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        return 0;
      }
      if (p->tempBuf[0] != '\0') {
        return 1;
      }
      LzmaDec_InitRc(p,p->tempBuf);
      p->tempBufSize = 0;
    }
    bVar6 = false;
    if (dicLimit <= p->dicPos) {
      if ((p->remainLen == 0) && (p->code == 0)) {
        *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        return 0;
      }
      if (finishMode == LZMA_FINISH_ANY) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return 0;
      }
      if (p->remainLen != 0) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return 1;
      }
      bVar6 = true;
    }
    if (p->needInitState != 0) {
      LzmaDec_InitStateReal(p);
    }
    if (p->tempBufSize == 0) {
      if ((SStack_48 < 0x14) || (bVar6)) {
        EVar3 = LzmaDec_TryDummy(p,(Byte *)srcLen_local,SStack_48);
        if (EVar3 == DUMMY_ERROR) {
          memcpy(p->tempBuf,srcLen_local,SStack_48);
          p->tempBufSize = (uint)SStack_48;
          *srcLen = SStack_48 + *srcLen;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return 0;
        }
        if ((bVar6) && (EVar3 != DUMMY_MATCH)) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return 1;
        }
        _rem = srcLen_local;
      }
      else {
        _rem = (SizeT *)((long)srcLen_local + (SStack_48 - 0x14));
      }
      p->buf = (Byte *)srcLen_local;
      iVar4 = LzmaDec_DecodeReal2(p,dicLimit,(Byte *)_rem);
      if (iVar4 != 0) {
        return 1;
      }
      uVar5 = (long)p->buf - (long)srcLen_local;
      *srcLen = uVar5 + *srcLen;
    }
    else {
      local_6c = 0;
      dummyRes_1 = p->tempBufSize;
      while ((uint)dummyRes_1 < 0x14 && local_6c < SStack_48) {
        p->tempBuf[(uint)dummyRes_1] = *(Byte *)((long)srcLen_local + (ulong)local_6c);
        local_6c = local_6c + 1;
        dummyRes_1 = dummyRes_1 + 1;
      }
      p->tempBufSize = dummyRes_1;
      if (((uint)dummyRes_1 < 0x14) || (bVar6)) {
        EVar3 = LzmaDec_TryDummy(p,p->tempBuf,(ulong)(uint)dummyRes_1);
        if (EVar3 == DUMMY_ERROR) {
          *srcLen = (ulong)local_6c + *srcLen;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return 0;
        }
        if ((bVar6) && (EVar3 != DUMMY_MATCH)) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return 1;
        }
      }
      p->buf = p->tempBuf;
      iVar4 = LzmaDec_DecodeReal2(p,dicLimit,p->buf);
      if (iVar4 != 0) {
        return 1;
      }
      local_6c = local_6c - (dummyRes_1 - ((int)p->buf - ((int)p + 0x70)));
      *srcLen = (ulong)local_6c + *srcLen;
      uVar5 = (ulong)local_6c;
      p->tempBufSize = 0;
    }
    srcLen_local = (SizeT *)(uVar5 + (long)srcLen_local);
    SStack_48 = SStack_48 - uVar5;
  } while( true );
}

Assistant:

SRes LzmaDec_DecodeToDic(CLzmaDec* p, SizeT dicLimit, const Byte* src, SizeT* srcLen,
                         ELzmaFinishMode finishMode, ELzmaStatus* status) {
  SizeT inSize = *srcLen;
  (*srcLen) = 0;
  LzmaDec_WriteRem(p, dicLimit);

  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->remainLen != kMatchSpecLenStart) {
    int checkEndMarkNow;

    if (p->needFlush != 0) {
      for (; inSize > 0 && p->tempBufSize < RC_INIT_SIZE; (*srcLen)++, inSize--)
        p->tempBuf[p->tempBufSize++] = *src++;
      if (p->tempBufSize < RC_INIT_SIZE) {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        return SZ_OK;
      }
      if (p->tempBuf[0] != 0)
        return SZ_ERROR_DATA;

      LzmaDec_InitRc(p, p->tempBuf);
      p->tempBufSize = 0;
    }

    checkEndMarkNow = 0;
    if (p->dicPos >= dicLimit) {
      if (p->remainLen == 0 && p->code == 0) {
        *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        return SZ_OK;
      }
      if (finishMode == LZMA_FINISH_ANY) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_OK;
      }
      if (p->remainLen != 0) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_ERROR_DATA;
      }
      checkEndMarkNow = 1;
    }

    if (p->needInitState)
      LzmaDec_InitStateReal(p);

    if (p->tempBufSize == 0) {
      SizeT processed;
      const Byte* bufLimit;
      if (inSize < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, src, inSize);
        if (dummyRes == DUMMY_ERROR) {
          memcpy(p->tempBuf, src, inSize);
          p->tempBufSize = (unsigned)inSize;
          (*srcLen) += inSize;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
        bufLimit = src;
      } else
        bufLimit = src + inSize - LZMA_REQUIRED_INPUT_MAX;
      p->buf = src;
      if (LzmaDec_DecodeReal2(p, dicLimit, bufLimit) != 0)
        return SZ_ERROR_DATA;
      processed = (SizeT)(p->buf - src);
      (*srcLen) += processed;
      src += processed;
      inSize -= processed;
    } else {
      unsigned rem = p->tempBufSize, lookAhead = 0;
      while (rem < LZMA_REQUIRED_INPUT_MAX && lookAhead < inSize)
        p->tempBuf[rem++] = src[lookAhead++];
      p->tempBufSize = rem;
      if (rem < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, p->tempBuf, rem);
        if (dummyRes == DUMMY_ERROR) {
          (*srcLen) += lookAhead;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
      }
      p->buf = p->tempBuf;
      if (LzmaDec_DecodeReal2(p, dicLimit, p->buf) != 0)
        return SZ_ERROR_DATA;
      lookAhead -= (rem - (unsigned)(p->buf - p->tempBuf));
      (*srcLen) += lookAhead;
      src += lookAhead;
      inSize -= lookAhead;
      p->tempBufSize = 0;
    }
  }
  if (p->code == 0)
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return (p->code == 0) ? SZ_OK : SZ_ERROR_DATA;
}